

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

bool __thiscall google::protobuf::internal::ExtensionSet::Extension::IsInitialized(Extension *this)

{
  Arena *pAVar1;
  char cVar2;
  CppType CVar3;
  int iVar4;
  Type *pTVar5;
  void *pvVar6;
  int index;
  
  CVar3 = anon_unknown_22::cpp_type(this->type);
  if (CVar3 == CPPTYPE_MESSAGE) {
    if (this->is_repeated == true) {
      index = 0;
      do {
        if ((int)((this->field_0).string_value)->_M_string_length <= index) {
          return true;
        }
        pTVar5 = RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                           ((RepeatedPtrFieldBase *)(this->field_0).string_value,index);
        iVar4 = (*pTVar5->_vptr_MessageLite[6])(pTVar5);
        index = index + 1;
      } while ((char)iVar4 != '\0');
      return false;
    }
    if ((this->field_0xa & 1) == 0) {
      pAVar1 = (((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_;
      if ((this->field_0xa & 0x10) == 0) {
        cVar2 = (*(code *)(pAVar1->impl_).options_.max_block_size)();
      }
      else {
        pvVar6 = (*(pAVar1->impl_).options_.block_alloc)
                           ((size_t)(this->field_0).repeated_string_value);
        cVar2 = (char)pvVar6;
      }
      if (cVar2 == '\0') {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool ExtensionSet::Extension::IsInitialized() const {
  if (cpp_type(type) == WireFormatLite::CPPTYPE_MESSAGE) {
    if (is_repeated) {
      for (int i = 0; i < repeated_message_value->size(); i++) {
        if (!repeated_message_value->Get(i).IsInitialized()) {
          return false;
        }
      }
    } else {
      if (!is_cleared) {
        if (is_lazy) {
          if (!lazymessage_value->IsInitialized()) return false;
        } else {
          if (!message_value->IsInitialized()) return false;
        }
      }
    }
  }
  return true;
}